

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void Js::JavascriptArray::InsertionSort<Memory::WriteBarrierPtr<void>>
               (WriteBarrierPtr<void> *list,uint32 length,CompareVarsInfo *cvInfo)

{
  WriteBarrierPtr<void> *pWVar1;
  _func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *p_Var2;
  void *pvVar3;
  WriteBarrierPtr<void> WVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  WriteBarrierPtr<void> *local_48;
  WriteBarrierPtr<void> local_38;
  WriteBarrierPtr<void> item;
  
  p_Var2 = cvInfo->compareType;
  local_38.ptr = (void *)0x0;
  if (1 < length) {
    local_48 = list + 1;
    uVar8 = 1;
    do {
      pvVar3 = list[uVar8].ptr;
      Memory::Recycler::WBSetBit((char *)&local_38);
      local_38.ptr = pvVar3;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
      bVar5 = (*p_Var2)(cvInfo,&local_38,list + (uVar8 - 1));
      uVar11 = uVar8 & 0xffffffff;
      if (bVar5) {
        uVar11 = 0;
      }
      uVar9 = (ulong)((int)uVar8 - 1);
      if (!bVar5) {
        uVar9 = uVar8 & 0xffffffff;
      }
      while( true ) {
        uVar7 = uVar9;
        uVar10 = (uint)uVar11;
        uVar6 = (uint)uVar7;
        uVar9 = uVar8;
        pWVar1 = local_48;
        WVar4.ptr = local_38.ptr;
        if (uVar6 <= uVar10) break;
        uVar6 = uVar6 - uVar10 >> 1;
        uVar9 = (ulong)(uVar6 + uVar10);
        bVar5 = (*p_Var2)(cvInfo,&local_38,list + uVar9);
        if (!bVar5) {
          uVar11 = (ulong)(uVar10 + uVar6 + 1);
          uVar9 = uVar7;
        }
      }
      for (; local_38.ptr = WVar4.ptr, uVar11 < uVar9; uVar9 = uVar9 - 1) {
        pvVar3 = pWVar1[-1].ptr;
        Memory::Recycler::WBSetBit((char *)pWVar1);
        pWVar1->ptr = pvVar3;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(pWVar1);
        pWVar1 = pWVar1 + -1;
        WVar4.ptr = local_38.ptr;
      }
      pWVar1 = list + uVar11;
      Memory::Recycler::WBSetBit((char *)pWVar1);
      pWVar1->ptr = WVar4.ptr;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(pWVar1);
      uVar8 = uVar8 + 1;
      local_48 = local_48 + 1;
    } while (uVar8 != length);
  }
  return;
}

Assistant:

void JavascriptArray::InsertionSort(T* list, uint32 length, JavascriptArray::CompareVarsInfo* cvInfo)
    {
        bool (*compareType)(JavascriptArray::CompareVarsInfo*, const void*, const void*) = cvInfo->compareType;
        uint32 sortedCount = 1, lowerBound = 0, insertPoint = 0, upperBound = 0;
        T item;
        while (sortedCount < length)
        {
            item = list[sortedCount];
            upperBound = sortedCount;
            insertPoint = sortedCount - 1; // this lets us check for already ordered first
            lowerBound = 0;
            for (;;)
            {
                if (compareType (cvInfo, &item, &list[insertPoint]) )
                {
                    upperBound = insertPoint;
                }
                else
                {
                    lowerBound = insertPoint + 1;
                }
                if (lowerBound >= upperBound)
                {
                    break;
                }
                insertPoint = lowerBound + ((upperBound - lowerBound) / 2);
            }
            insertPoint = sortedCount;
            while (insertPoint > lowerBound)
            {
                list[insertPoint] = list[insertPoint - 1];
                --insertPoint;
            }
            list[lowerBound] = item;
            ++sortedCount;
        }
    }